

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

void lj_meta_init(lua_State *L)

{
  uint64_t uVar1;
  GCstr *pGVar2;
  bool bVar3;
  GCstr *s;
  char *pcStack_30;
  uint32_t mm;
  char *q;
  char *p;
  global_State *g;
  char *metanames;
  lua_State *L_local;
  
  uVar1 = (L->glref).ptr64;
  s._4_4_ = 0;
  q = 
  "__index__newindex__gc__mode__eq__len__lt__le__concat__call__add__sub__mul__div__mod__pow__unm__metatable__tostring__new__pairs__ipairs"
  ;
  while (*q != '\0') {
    pcStack_30 = q + 2;
    while( true ) {
      bVar3 = false;
      if (*pcStack_30 != '\0') {
        bVar3 = *pcStack_30 != '_';
      }
      if (!bVar3) break;
      pcStack_30 = pcStack_30 + 1;
    }
    pGVar2 = lj_str_new(L,q,(long)pcStack_30 - (long)q);
    *(GCstr **)(uVar1 + 0x1a8 + (ulong)s._4_4_ * 8) = pGVar2;
    s._4_4_ = s._4_4_ + 1;
    q = pcStack_30;
  }
  return;
}

Assistant:

void lj_meta_init(lua_State *L)
{
#define MMNAME(name)	"__" #name
  const char *metanames = MMDEF(MMNAME);
#undef MMNAME
  global_State *g = G(L);
  const char *p, *q;
  uint32_t mm;
  for (mm = 0, p = metanames; *p; mm++, p = q) {
    GCstr *s;
    for (q = p+2; *q && *q != '_'; q++) ;
    s = lj_str_new(L, p, (size_t)(q-p));
    /* NOBARRIER: g->gcroot[] is a GC root. */
    setgcref(g->gcroot[GCROOT_MMNAME+mm], obj2gco(s));
  }
}